

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryAppendFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  char in_AL;
  AppendableFile *extraout_RDX;
  bool in_R8B;
  PathPtr path_00;
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> MVar2;
  DiskHandle local_18;
  OwnFd local_14;
  AppendableFile *pAVar1;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  local_18.fd.fd._0_1_ = in_AL;
  DiskHandle::tryOpenFileInternal(&local_18,path_00,mode,in_R8B);
  MVar2 = Maybe<kj::OwnFd>::map<kj::Own<kj::AppendableFile,_std::nullptr_t>_(&)(kj::OwnFd)>
                    ((Maybe<kj::OwnFd> *)this,
                     (_func_Own<kj::AppendableFile,_std::nullptr_t>_OwnFd *)&local_18);
  pAVar1 = MVar2.ptr.ptr;
  if ((char)local_18.fd.fd == '\x01') {
    OwnFd::~OwnFd(&local_14);
    pAVar1 = extraout_RDX;
  }
  MVar2.ptr.ptr = pAVar1;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryAppendFile(path, mode);
  }